

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O1

XXH_errorcode XXH64_reset(XXH64_state_t *statePtr,unsigned_long_long seed)

{
  statePtr->total_len = 0;
  statePtr->v1 = seed + 0x60ea27eeadc0b5d6;
  statePtr->v2 = seed + 0xc2b2ae3d27d4eb4f;
  statePtr->v3 = seed;
  statePtr->v4 = seed + 0x61c8864e7a143579;
  statePtr->mem64[0] = 0;
  statePtr->mem64[1] = 0;
  statePtr->mem64[2] = 0;
  statePtr->mem64[3] = 0;
  statePtr->memsize = 0;
  statePtr->reserved[0] = 0;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_reset(XXH64_state_t* statePtr, unsigned long long seed)
{
    XXH64_state_t state;   /* using a local state to memcpy() in order to avoid strict-aliasing warnings */
    memset(&state, 0, sizeof(state)-8);   /* do not write into reserved, for future removal */
    state.v1 = seed + PRIME64_1 + PRIME64_2;
    state.v2 = seed + PRIME64_2;
    state.v3 = seed + 0;
    state.v4 = seed - PRIME64_1;
    memcpy(statePtr, &state, sizeof(state));
    return XXH_OK;
}